

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void absl::CleanupFlags(void)

{
  FlagList *pFVar1;
  FlagMap *pFVar2;
  vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
  *unaff_retaddr;
  
  if (!CleanupFlags::is_shutdown) {
    pFVar1 = internal::anon_unknown_1::GetFlagList();
    if (pFVar1 != (FlagList *)0x0) {
      std::
      vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
      ::~vector(unaff_retaddr);
      operator_delete(pFVar1,0x18);
    }
    pFVar2 = internal::(anonymous_namespace)::GetFlagMap_abi_cxx11_();
    if (pFVar2 != (FlagMap *)0x0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
              *)0x402c50);
      operator_delete(pFVar2,0x30);
    }
    CleanupFlags::is_shutdown = true;
  }
  return;
}

Assistant:

void CleanupFlags() {
  static bool is_shutdown = false;
  if (!is_shutdown) {
    delete internal::GetFlagList();
    delete internal::GetFlagMap();
    is_shutdown = true;
  }
}